

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char cVar1;
  bool bVar2;
  int value_00;
  type tVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  buffer<char> *in_RDX;
  ulong in_RSI;
  uint in_EDI;
  undefined8 in_XMM0_Qa;
  char *fraction_end;
  int fraction_size;
  char *p;
  int exp;
  char sign;
  char *exp_pos;
  char *end;
  int fraction_size_1;
  char *p_1;
  char *end_1;
  anon_class_1_0_00000001 is_digit;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  char format [7];
  size_t in_stack_ffffffffffffff08;
  buffer<char> *in_stack_ffffffffffffff10;
  int local_c0;
  char local_b8;
  char local_b7;
  char local_b5;
  uint local_b4;
  char *local_b0;
  int local_a4;
  char *local_a0;
  int local_98;
  char *local_90;
  char *local_78;
  anon_class_1_0_00000001 local_61;
  type local_60;
  int local_5c;
  code *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  char local_2f [7];
  buffer<char> *local_28;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_c;
  int local_4;
  
  cVar1 = (char)(in_RSI >> 0x20);
  if ((cVar1 == '\0') || (local_1c = in_EDI, cVar1 == '\x01')) {
    local_b4 = in_EDI;
    if ((int)in_EDI < 0) {
      local_b4 = 6;
    }
    local_1c = local_b4 - 1;
  }
  local_38 = local_2f + 1;
  local_2f[0] = '%';
  if ((((uint)(in_RSI >> 0x35) & 1) != 0) && (cVar1 == '\x03')) {
    local_38 = local_2f + 2;
    local_2f[1] = 0x23;
  }
  if (-1 < (int)local_1c) {
    pcVar6 = local_38 + 1;
    *local_38 = '.';
    local_38 = local_38 + 2;
    *pcVar6 = '*';
  }
  if (cVar1 == '\x03') {
    local_b8 = 'A';
    if ((in_RSI & 0x1000000000000) == 0) {
      local_b8 = 'a';
    }
    local_b7 = local_b8;
  }
  else {
    local_b5 = 'f';
    if (cVar1 != '\x02') {
      local_b5 = 'e';
    }
    local_b7 = local_b5;
  }
  *local_38 = local_b7;
  local_38[1] = '\0';
  local_38 = local_38 + 1;
  local_28 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_c = in_RSI;
  local_40 = buffer<char>::size(in_RDX);
  while( true ) {
    while( true ) {
      local_48 = buffer<char>::data(local_28);
      local_48 = local_48 + local_40;
      sVar4 = buffer<char>::capacity(local_28);
      local_50 = sVar4 - local_40;
      local_58 = snprintf;
      if ((int)local_1c < 0) {
        local_c0 = snprintf(local_48,local_50,local_2f,local_18,snprintf);
      }
      else {
        local_c0 = snprintf(local_48,local_50,local_2f,local_18,(ulong)local_1c,snprintf);
      }
      local_5c = local_c0;
      if (-1 < local_c0) break;
      buffer<char>::capacity(local_28);
      buffer<char>::reserve(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    local_60 = to_unsigned<int>(local_c0);
    if (local_60 < local_50) break;
    buffer<char>::reserve(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  cVar1 = (char)(local_c >> 0x20);
  if (cVar1 == '\x02') {
    if (local_1c == 0) {
      buffer<char>::resize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_4 = 0;
    }
    else {
      pcVar5 = local_48 + local_60;
      pcVar6 = pcVar5;
      do {
        local_78 = pcVar6;
        pcVar6 = local_78 + -1;
        bVar2 = snprintf_float<double>::anon_class_1_0_00000001::operator()(&local_61,*pcVar6);
      } while (bVar2);
      value_00 = ((int)pcVar5 - (int)pcVar6) + -1;
      tVar3 = to_unsigned<int>(value_00);
      memmove(pcVar6,local_78,(ulong)tVar3);
      buffer<char>::resize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_4 = -value_00;
    }
  }
  else if (cVar1 == '\x03') {
    buffer<char>::resize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_4 = 0;
  }
  else {
    pcVar6 = local_48 + local_60;
    do {
      local_90 = pcVar6;
      pcVar6 = local_90 + -1;
    } while (*pcVar6 != 'e');
    local_98 = 0;
    local_a0 = local_90 + 1;
    do {
      pcVar5 = local_a0 + 1;
      local_98 = local_98 * 10 + *local_a0 + -0x30;
      local_a0 = pcVar5;
    } while (pcVar5 != local_48 + local_60);
    if (*local_90 == '-') {
      local_98 = -local_98;
    }
    local_a4 = 0;
    if (pcVar6 != local_48 + 1) {
      for (local_b0 = local_90 + -2; *local_b0 == '0'; local_b0 = local_b0 + -1) {
      }
      local_a4 = ((int)local_b0 - (int)local_48) + -1;
      pcVar6 = local_48 + 1;
      pcVar5 = local_48 + 2;
      tVar3 = to_unsigned<int>(local_a4);
      memmove(pcVar6,pcVar5,(ulong)tVar3);
    }
    to_unsigned<int>(local_a4);
    buffer<char>::resize(local_28,in_stack_ffffffffffffff08);
    local_4 = local_98 - local_a4;
  }
  return local_4;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto becase of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}